

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_to_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,size_t len,
               size_t *written,_Bool is_elements)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  wally_tx_input *pwVar5;
  undefined8 *puVar6;
  uint32_t *bytes_out_00;
  uint8_t *bytes_out_01;
  uint64_t *puVar7;
  uchar *puVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  wally_tx_output *output_1;
  wally_tx_witness_item *stack_2;
  wally_tx_witness_item *stack_1;
  size_t num_items_1;
  wally_tx_input *input_2;
  wally_tx_witness_item *stack;
  size_t num_items;
  wally_tx_input *input_1;
  wally_tx_output *output;
  size_t num_outputs;
  wally_tx_input *input;
  uchar *p;
  _Bool sh_single;
  _Bool sh_none;
  _Bool sh_rangeproof;
  size_t sStack_68;
  _Bool anyonecanpay;
  size_t witness_count;
  size_t j;
  size_t i;
  size_t n;
  size_t *psStack_40;
  _Bool is_elements_local;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  tx_serialize_opts *ptStack_20;
  uint32_t flags_local;
  tx_serialize_opts *opts_local;
  wally_tx *tx_local;
  
  n._7_1_ = is_elements;
  bVar11 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar11 = (opts->sighash & 0x80) != 0;
  }
  bVar12 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar12 = (opts->sighash & 0x40) != 0;
  }
  bVar13 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar13 = (opts->sighash & 0x1f) == 2;
  }
  bVar14 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar14 = (opts->sighash & 0x1f) == 3;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  psStack_40 = written;
  written_local = (size_t *)len;
  len_local = (size_t)bytes_out;
  bytes_out_local._4_4_ = flags;
  ptStack_20 = opts;
  opts_local = (tx_serialize_opts *)tx;
  _Var2 = is_valid_tx(tx);
  if ((((_Var2) && ((bytes_out_local._4_4_ & 0xfffffff0) == 0)) && (len_local != 0)) &&
     ((psStack_40 != (size_t *)0x0 &&
      (iVar3 = tx_get_length((wally_tx *)opts_local,ptStack_20,bytes_out_local._4_4_,&i,
                             (_Bool)(n._7_1_ & 1)), iVar3 == 0)))) {
    if ((ptStack_20 == (tx_serialize_opts *)0x0) || ((bytes_out_local._4_4_ & 1) == 0)) {
      if (((bytes_out_local._4_4_ & 4) == 0) &&
         ((opts_local->script == (uchar *)0x0 || (*(long *)&opts_local->bip143 == 0)))) {
        tx_local._4_4_ = -2;
      }
      else {
        if (opts_local->script == (uchar *)0x0) {
          if ((bytes_out_local._4_4_ & 8) == 0) {
            return -2;
          }
          bytes_out_local._4_4_ = bytes_out_local._4_4_ & 0xfffffffe;
        }
        if (written_local < i) {
          *psStack_40 = i;
          tx_local._4_4_ = 0;
        }
        else if ((ptStack_20 == (tx_serialize_opts *)0x0) || ((ptStack_20->bip143 & 1U) == 0)) {
          if ((bytes_out_local._4_4_ & 1) != 0) {
            iVar3 = wally_tx_get_witness_count((wally_tx *)opts_local,&stack0xffffffffffffff98);
            if (iVar3 != 0) {
              return -2;
            }
            if (sStack_68 == 0) {
              bytes_out_local._4_4_ = bytes_out_local._4_4_ & 0xfffffffe;
            }
          }
          sVar4 = uint32_to_le_bytes(opts_local->sighash,bytes_out);
          pwVar5 = (wally_tx_input *)(bytes_out + sVar4);
          input = pwVar5;
          if ((n._7_1_ & 1) == 0) {
            if ((bytes_out_local._4_4_ & 1) != 0) {
              pwVar5->txhash[0] = '\0';
              pwVar5->txhash[1] = '\x01';
              input = (wally_tx_input *)(pwVar5->txhash + 2);
            }
          }
          else if (ptStack_20 == (tx_serialize_opts *)0x0) {
            input = (wally_tx_input *)(pwVar5->txhash + 1);
            pwVar5->txhash[0] = (bytes_out_local._4_4_ & 1) != 0;
          }
          if (bVar11) {
            input->txhash[0] = '\x01';
            input = (wally_tx_input *)(input->txhash + 1);
          }
          else {
            sVar4 = varint_to_bytes((uint64_t)opts_local->script,input->txhash);
            input = (wally_tx_input *)(input->txhash + sVar4);
          }
          for (j = 0; j < opts_local->script; j = j + 1) {
            puVar6 = (undefined8 *)(opts_local->index + j * 0xd0);
            if ((!bVar11) || (j == ptStack_20->index)) {
              *(undefined8 *)input->txhash = *puVar6;
              *(undefined8 *)(input->txhash + 8) = puVar6[1];
              *(undefined8 *)(input->txhash + 0x10) = puVar6[2];
              *(undefined8 *)(input->txhash + 0x18) = puVar6[3];
              bytes_out_00 = &input->index;
              if ((ptStack_20 == (tx_serialize_opts *)0x0) && ((*(byte *)(puVar6 + 8) & 2) != 0)) {
                sVar4 = uint32_to_le_bytes(*(uint *)(puVar6 + 4) | 0x80000000,(uchar *)bytes_out_00)
                ;
              }
              else if ((ptStack_20 == (tx_serialize_opts *)0x0) &&
                      ((*(byte *)(puVar6 + 8) & 4) != 0)) {
                sVar4 = uint32_to_le_bytes(*(uint *)(puVar6 + 4) | 0x40000000,(uchar *)bytes_out_00)
                ;
              }
              else {
                sVar4 = uint32_to_le_bytes(*(uint32_t *)(puVar6 + 4),(uchar *)bytes_out_00);
              }
              input = (wally_tx_input *)(sVar4 + (long)bytes_out_00);
              if (ptStack_20 == (tx_serialize_opts *)0x0) {
                sVar4 = varbuff_to_bytes((uchar *)puVar6[5],puVar6[6],(uchar *)input);
                input = (wally_tx_input *)(input->txhash + sVar4);
              }
              else if (j == ptStack_20->index) {
                sVar4 = varbuff_to_bytes(ptStack_20->script,ptStack_20->script_len,(uchar *)input);
                input = (wally_tx_input *)(input->txhash + sVar4);
              }
              else {
                input->txhash[0] = '\0';
                input = (wally_tx_input *)(input->txhash + 1);
              }
              if (((bVar13) || (bVar14)) && (j != ptStack_20->index)) {
                sVar4 = uint32_to_le_bytes(0,input->txhash);
              }
              else {
                sVar4 = uint32_to_le_bytes(*(uint32_t *)((long)puVar6 + 0x24),input->txhash);
              }
              input = (wally_tx_input *)(input->txhash + sVar4);
              if ((*(byte *)(puVar6 + 8) & 2) != 0) {
                if ((n._7_1_ & 1) == 0) {
                  return -2;
                }
                *(undefined8 *)input->txhash = *(undefined8 *)((long)puVar6 + 0x41);
                *(undefined8 *)(input->txhash + 8) = *(undefined8 *)((long)puVar6 + 0x49);
                *(undefined8 *)(input->txhash + 0x10) = *(undefined8 *)((long)puVar6 + 0x51);
                *(undefined8 *)(input->txhash + 0x18) = *(undefined8 *)((long)puVar6 + 0x59);
                uVar1 = *(undefined8 *)((long)puVar6 + 0x61);
                input->index = (int)uVar1;
                input->sequence = (int)((ulong)uVar1 >> 0x20);
                input->script = *(uchar **)((long)puVar6 + 0x69);
                input->script_len = *(size_t *)((long)puVar6 + 0x71);
                input->witness = *(wally_tx_witness_stack **)((long)puVar6 + 0x79);
                sVar4 = confidential_value_to_bytes
                                  ((uchar *)puVar6[0x11],puVar6[0x12],&input->features);
                bytes_out_01 = &input->features + sVar4;
                sVar4 = confidential_value_to_bytes((uchar *)puVar6[0x13],puVar6[0x14],bytes_out_01)
                ;
                input = (wally_tx_input *)(bytes_out_01 + sVar4);
              }
            }
          }
          if (bVar13) {
            input->txhash[0] = '\0';
            input = (wally_tx_input *)(input->txhash + 1);
          }
          else {
            if (bVar14) {
              local_e0 = ptStack_20->index + 1;
            }
            else {
              local_e0 = *(uint64_t *)&opts_local->bip143;
            }
            sVar4 = varint_to_bytes(local_e0,input->txhash);
            input = (wally_tx_input *)(input->txhash + sVar4);
            for (j = 0; j < local_e0; j = j + 1) {
              puVar7 = (uint64_t *)(opts_local->satoshi + j * 0x70);
              if ((bVar14) && (j != ptStack_20->index)) {
                input->txhash[0] = 0xff;
                input->txhash[1] = 0xff;
                input->txhash[2] = 0xff;
                input->txhash[3] = 0xff;
                input->txhash[4] = 0xff;
                input->txhash[5] = 0xff;
                input->txhash[6] = 0xff;
                input->txhash[7] = 0xff;
                input->txhash[8] = '\0';
                input = (wally_tx_input *)(input->txhash + 9);
              }
              else {
                if ((puVar7[3] & 1) == 0) {
                  sVar4 = uint64_to_le_bytes(*puVar7,input->txhash);
                  input = (wally_tx_input *)(input->txhash + sVar4);
                }
                else {
                  if ((n._7_1_ & 1) == 0) {
                    return -2;
                  }
                  sVar4 = confidential_value_to_bytes((uchar *)puVar7[4],puVar7[5],input->txhash);
                  puVar8 = input->txhash + sVar4;
                  sVar4 = confidential_value_to_bytes((uchar *)puVar7[6],puVar7[7],puVar8);
                  sVar10 = confidential_value_to_bytes((uchar *)puVar7[8],puVar7[9],puVar8 + sVar4);
                  input = (wally_tx_input *)(puVar8 + sVar4 + sVar10);
                }
                sVar4 = varbuff_to_bytes((uchar *)puVar7[1],puVar7[2],input->txhash);
                input = (wally_tx_input *)(input->txhash + sVar4);
                if (((n._7_1_ & 1) != 0) && (bVar12)) {
                  sVar4 = varbuff_to_bytes((uchar *)puVar7[0xc],puVar7[0xd],(uchar *)input);
                  sVar10 = varbuff_to_bytes((uchar *)puVar7[10],puVar7[0xb],input->txhash + sVar4);
                  input = (wally_tx_input *)(input->txhash + sVar4 + sVar10);
                }
              }
            }
          }
          if (((n._7_1_ & 1) == 0) && ((bytes_out_local._4_4_ & 1) != 0)) {
            for (j = 0; j < opts_local->script; j = j + 1) {
              lVar9 = opts_local->index + j * 0xd0;
              if (*(long *)(lVar9 + 0x38) == 0) {
                local_e8 = 0;
              }
              else {
                local_e8 = *(uint64_t *)(*(long *)(lVar9 + 0x38) + 8);
              }
              sVar4 = varint_to_bytes(local_e8,input->txhash);
              input = (wally_tx_input *)(input->txhash + sVar4);
              for (witness_count = 0; witness_count < local_e8; witness_count = witness_count + 1) {
                puVar6 = (undefined8 *)(**(long **)(lVar9 + 0x38) + witness_count * 0x10);
                sVar4 = varbuff_to_bytes((uchar *)*puVar6,puVar6[1],input->txhash);
                input = (wally_tx_input *)(input->txhash + sVar4);
              }
            }
          }
          sVar4 = uint32_to_le_bytes(opts_local->tx_sighash,input->txhash);
          input = (wally_tx_input *)(input->txhash + sVar4);
          if (ptStack_20 != (tx_serialize_opts *)0x0) {
            uint32_to_le_bytes(ptStack_20->tx_sighash,(uchar *)input);
          }
          if (((n._7_1_ & 1) != 0) && ((bytes_out_local._4_4_ & 1) != 0)) {
            for (j = 0; j < opts_local->script; j = j + 1) {
              lVar9 = opts_local->index + j * 0xd0;
              sVar4 = varbuff_to_bytes(*(uchar **)(lVar9 + 0xa8),*(size_t *)(lVar9 + 0xb0),
                                       input->txhash);
              puVar8 = input->txhash + sVar4;
              sVar4 = varbuff_to_bytes(*(uchar **)(lVar9 + 0xb8),*(size_t *)(lVar9 + 0xc0),puVar8);
              if (*(long *)(lVar9 + 0x38) == 0) {
                local_f0 = 0;
              }
              else {
                local_f0 = *(uint64_t *)(*(long *)(lVar9 + 0x38) + 8);
              }
              sVar10 = varint_to_bytes(local_f0,puVar8 + sVar4);
              input = (wally_tx_input *)(puVar8 + sVar4 + sVar10);
              for (witness_count = 0; witness_count < local_f0; witness_count = witness_count + 1) {
                puVar6 = (undefined8 *)(**(long **)(lVar9 + 0x38) + witness_count * 0x10);
                sVar4 = varbuff_to_bytes((uchar *)*puVar6,puVar6[1],input->txhash);
                input = (wally_tx_input *)(input->txhash + sVar4);
              }
              if (*(long *)(lVar9 + 200) == 0) {
                local_f8 = 0;
              }
              else {
                local_f8 = *(uint64_t *)(*(long *)(lVar9 + 200) + 8);
              }
              sVar4 = varint_to_bytes(local_f8,input->txhash);
              input = (wally_tx_input *)(input->txhash + sVar4);
              for (witness_count = 0; witness_count < local_f8; witness_count = witness_count + 1) {
                puVar6 = (undefined8 *)(**(long **)(lVar9 + 200) + witness_count * 0x10);
                sVar4 = varbuff_to_bytes((uchar *)*puVar6,puVar6[1],input->txhash);
                input = (wally_tx_input *)(input->txhash + sVar4);
              }
            }
            for (j = 0; j < *(ulong *)&opts_local->bip143; j = j + 1) {
              lVar9 = opts_local->satoshi + j * 0x70;
              sVar4 = varbuff_to_bytes(*(uchar **)(lVar9 + 0x50),*(size_t *)(lVar9 + 0x58),
                                       input->txhash);
              sVar10 = varbuff_to_bytes(*(uchar **)(lVar9 + 0x60),*(size_t *)(lVar9 + 0x68),
                                        input->txhash + sVar4);
              input = (wally_tx_input *)(input->txhash + sVar4 + sVar10);
            }
          }
          *psStack_40 = i;
          tx_local._4_4_ = 0;
        }
        else {
          tx_local._4_4_ =
               tx_to_bip143_bytes((wally_tx *)opts_local,ptStack_20,bytes_out_local._4_4_,
                                  (uchar *)len_local,(size_t)written_local,psStack_40);
        }
      }
    }
    else {
      tx_local._4_4_ = -1;
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_to_bytes(const struct wally_tx *tx,
                       const struct tx_serialize_opts *opts,
                       uint32_t flags,
                       unsigned char *bytes_out, size_t len,
                       size_t *written,
                       bool is_elements)
{
    size_t n, i, j, witness_count;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || !written ||
        tx_get_length(tx, opts, flags, &n, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (opts && (flags & WALLY_TX_FLAG_USE_WITNESS))
        return WALLY_ERROR; /* Segwit tx hashing is handled elsewhere */

    if (!(flags & WALLY_TX_FLAG_ALLOW_PARTIAL)) {
        /* 0-input/output txs can be only be written with this flag */
        if (!tx->num_inputs || !tx->num_outputs)
            return WALLY_EINVAL;
    }

    if (!tx->num_inputs) {
        /* 0-input txs can only be written in the pre-BIP144 format,
         * since otherwise the resulting tx is ambiguous.
         * Used in PSBTs while building the tx for example.
         */
        if (!(flags & WALLY_TX_FLAG_PRE_BIP144))
            return WALLY_EINVAL;
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    if (n > len) {
        *written = n;
        return WALLY_OK;
    }

    if (opts && opts->bip143)
        return tx_to_bip143_bytes(tx, opts, flags, bytes_out, len, written);

    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (wally_tx_get_witness_count(tx, &witness_count) != WALLY_OK)
            return WALLY_EINVAL;
        if (!witness_count)
            flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    p += uint32_to_le_bytes(tx->version, p);
    if (is_elements) {
        if (!opts)
            *p++ = flags & WALLY_TX_FLAG_USE_WITNESS ? 1 : 0;
    } else {
        if (flags & WALLY_TX_FLAG_USE_WITNESS) {
            *p++ = 0; /* Write BIP 144 marker */
            *p++ = 1; /* Write BIP 144 flag */
        }
    }
    if (anyonecanpay)
        *p++ = 1;
    else
        p += varint_to_bytes(tx->num_inputs, p);

    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        memcpy(p, input->txhash, sizeof(input->txhash));
        p += sizeof(input->txhash);
        if (!opts && (input->features & WALLY_TX_IS_ISSUANCE))
            p += uint32_to_le_bytes(input->index | WALLY_TX_ISSUANCE_FLAG, p);
        else if (!opts && (input->features & WALLY_TX_IS_PEGIN))
            p += uint32_to_le_bytes(input->index | WALLY_TX_PEGIN_FLAG, p);
        else
            p += uint32_to_le_bytes(input->index, p);
        if (opts) {
            if (i == opts->index)
                p += varbuff_to_bytes(opts->script, opts->script_len, p);
            else
                *p++ = 0; /* Blank scripts for non-signing inputs */
        } else
            p += varbuff_to_bytes(input->script, input->script_len, p);

        if ((sh_none || sh_single) && i != opts->index)
            p += uint32_to_le_bytes(0, p);
        else
            p += uint32_to_le_bytes(input->sequence, p);
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            if (!is_elements)
                return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
            memcpy(p, input->blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            memcpy(p, input->entropy, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            p += confidential_value_to_bytes(input->issuance_amount, input->issuance_amount_len, p);
            p += confidential_value_to_bytes(input->inflation_keys, input->inflation_keys_len, p);
#endif
        }
    }

    if (sh_none)
        *p++ = 0;
    else {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;
        p += varint_to_bytes(num_outputs, p);

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index) {
                memcpy(p, EMPTY_OUTPUT, sizeof(EMPTY_OUTPUT));
                p += sizeof(EMPTY_OUTPUT);
            } else {
                if (output->features & WALLY_TX_IS_ELEMENTS) {
                    if (!is_elements)
                        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
                    p += confidential_value_to_bytes(output->asset, output->asset_len, p);
                    p += confidential_value_to_bytes(output->value, output->value_len, p);
                    p += confidential_value_to_bytes(output->nonce, output->nonce_len, p);
#endif
                } else {
                    p += uint64_to_le_bytes(output->satoshi, p);
                }
                p += varbuff_to_bytes(output->script, output->script_len, p);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    p += varbuff_to_bytes(output->rangeproof,
                                          output->rangeproof_len, p);
                    p += varbuff_to_bytes(output->surjectionproof,
                                          output->surjectionproof_len, p);
                }
#endif
            }
        }
    }

    if (!is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
    }

    p += uint32_to_le_bytes(tx->locktime, p);
    if (opts)
        uint32_to_le_bytes(opts->tx_sighash, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items;
            p += varbuff_to_bytes(input->issuance_amount_rangeproof, input->issuance_amount_rangeproof_len, p);
            p += varbuff_to_bytes(input->inflation_keys_rangeproof, input->inflation_keys_rangeproof_len, p);
            num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
            num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->pegin_witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
        for (i = 0; i < tx->num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            p += varbuff_to_bytes(output->surjectionproof, output->surjectionproof_len, p);
            p += varbuff_to_bytes(output->rangeproof, output->rangeproof_len, p);
        }
    }
#endif
    *written = n;
    return WALLY_OK;
}